

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
          (EpsCopyOutputStream *this,void *data,int size,uint8_t *ptr)

{
  ptrdiff_t pVar1;
  int local_2c;
  uint8_t *puStack_28;
  int s;
  uint8_t *ptr_local;
  void *pvStack_18;
  int size_local;
  void *data_local;
  EpsCopyOutputStream *this_local;
  
  pVar1 = GetSize(this,ptr);
  local_2c = (int)pVar1;
  puStack_28 = ptr;
  ptr_local._4_4_ = size;
  pvStack_18 = data;
  while (local_2c < ptr_local._4_4_) {
    memcpy(puStack_28,pvStack_18,(long)local_2c);
    ptr_local._4_4_ = ptr_local._4_4_ - local_2c;
    pvStack_18 = (void *)((long)pvStack_18 + (long)local_2c);
    puStack_28 = EnsureSpaceFallback(this,puStack_28 + local_2c);
    pVar1 = GetSize(this,puStack_28);
    local_2c = (int)pVar1;
  }
  memcpy(puStack_28,pvStack_18,(long)ptr_local._4_4_);
  return puStack_28 + ptr_local._4_4_;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteRawFallback(const void* data, int size,
                                             uint8_t* ptr) {
  int s = GetSize(ptr);
  while (s < size) {
    std::memcpy(ptr, data, s);
    size -= s;
    data = static_cast<const uint8_t*>(data) + s;
    ptr = EnsureSpaceFallback(ptr + s);
    s = GetSize(ptr);
  }
  std::memcpy(ptr, data, size);
  return ptr + size;
}